

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  cmState **ppcVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  _Alloc_hider __s;
  cmStateSnapshot *extraout_RAX;
  undefined4 extraout_var_00;
  iterator iVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  undefined8 *puVar12;
  undefined8 uVar13;
  char *pcVar14;
  cmStateSnapshot *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  cmStateSnapshot *extraout_RAX_03;
  size_t sVar16;
  ostream *poVar17;
  undefined7 in_register_00000009;
  cmStateSnapshot *pcVar18;
  cmStateSnapshot *pcVar19;
  MessageType MVar20;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  cmStateSnapshot *pcVar21;
  cmStateSnapshot *pcVar22;
  string varresult;
  string result;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  t_lookup lookup;
  ostringstream ostr;
  undefined1 local_350 [32];
  string *local_330;
  MessageType local_324;
  string local_320;
  cmMakefile *local_300;
  allocator local_2f4;
  allocator local_2f3;
  allocator local_2f2;
  allocator local_2f1;
  cmStateSnapshot *local_2f0;
  undefined1 *local_2e8;
  cmStateSnapshot *local_2e0;
  undefined1 local_2d8;
  undefined7 uStack_2d7;
  cmStateSnapshot *local_2c8;
  iterator iStack_2c0;
  t_lookup *local_2b8;
  undefined4 local_2a4;
  string local_2a0;
  string local_280;
  long local_260;
  undefined4 local_258;
  undefined4 local_254;
  string *local_250;
  cmStateSnapshot *local_248;
  RegularExpression *local_240;
  cmStateSnapshot *local_238;
  cmState *local_230;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  cmStateSnapshot local_198 [4];
  ios_base local_138 [264];
  
  local_258 = CONCAT31(in_register_00000089,atOnly);
  local_254 = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_2a4 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pcVar21 = (cmStateSnapshot *)(source->_M_dataplus)._M_p;
  local_2e8 = &local_2d8;
  local_2e0 = (cmStateSnapshot *)0x0;
  local_2d8 = 0;
  local_330 = errorstr;
  local_250 = source;
  std::__cxx11::string::reserve((ulong)&local_2e8);
  local_260 = line;
  local_2c8 = (cmStateSnapshot *)0x0;
  iStack_2c0._M_current = (t_lookup *)0x0;
  local_2b8 = (t_lookup *)0x0;
  local_230 = this->GlobalGenerator->CMakeInstance->State;
  local_240 = &this->cmNamedCurly;
  iVar11._M_current = (t_lookup *)&this->StateSnapshot;
  local_324 = LOG;
  local_248 = (cmStateSnapshot *)0x0;
  local_2f0 = (cmStateSnapshot *)0x0;
  pcVar18 = pcVar21;
  local_300 = this;
  local_238 = (cmStateSnapshot *)iVar11._M_current;
  do {
    bVar1 = *(byte *)&pcVar21->State;
    pcVar19 = pcVar18;
    if (bVar1 < 0x40) {
      if (bVar1 == 0) {
        iVar11._M_current = (t_lookup *)CONCAT71((int7)((ulong)iVar11._M_current >> 8),1);
        local_248 = (cmStateSnapshot *)iVar11._M_current;
      }
      else if (bVar1 == 10) {
        local_260 = local_260 + 1;
      }
      else {
        if (bVar1 != 0x24) goto LAB_003d5890;
        if ((char)local_258 != '\0') goto LAB_003d56a7;
        uVar3 = (ulong)local_280._M_dataplus._M_p >> 0x20;
        local_280._M_dataplus._M_p = (pointer)(uVar3 << 0x20);
        local_280._M_string_length = 0;
        pcVar19 = (cmStateSnapshot *)((long)&pcVar21->State + 1);
        cVar2 = *(char *)((long)&pcVar21->State + 1);
        iVar11._M_current = (t_lookup *)0x0;
        if (cVar2 == '\0') {
          iVar11._M_current =
               (t_lookup *)std::__cxx11::string::append((char *)&local_2e8,(ulong)pcVar18);
          pcVar22 = (cmStateSnapshot *)0x0;
        }
        else if (cVar2 == '<') {
LAB_003d60bf:
          pcVar22 = (cmStateSnapshot *)0x0;
          pcVar19 = pcVar18;
        }
        else if (cVar2 == '{') {
          pcVar22 = (cmStateSnapshot *)((long)&pcVar21->State + 2);
          local_280._M_dataplus._M_p = (pointer)(uVar3 << 0x20);
          pcVar19 = pcVar18;
        }
        else {
          iVar9 = strncmp((char *)pcVar19,"ENV{",4);
          iVar11._M_current = (t_lookup *)CONCAT44(extraout_var_01,iVar9);
          if (iVar9 == 0) {
            pcVar22 = (cmStateSnapshot *)((long)&pcVar21->State + 5);
            local_280._M_dataplus._M_p._0_4_ = 1;
            pcVar19 = pcVar18;
          }
          else {
            iVar9 = strncmp((char *)pcVar19,"CACHE{",6);
            iVar11._M_current = (t_lookup *)CONCAT44(extraout_var_02,iVar9);
            if (iVar9 != 0) {
              bVar6 = cmsys::RegularExpression::find(local_240,(char *)pcVar19);
              iVar11._M_current = (t_lookup *)CONCAT71(extraout_var,bVar6);
              if (bVar6) {
                local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_320,pcVar19,
                           (char *)(((long)(local_300->cmNamedCurly).endp[0] -
                                    (long)(local_300->cmNamedCurly).searchstring) + (long)pcVar19));
                puVar12 = (undefined8 *)
                          std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,0x576e31);
                local_350._0_8_ = local_350 + 0x10;
                pcVar19 = (cmStateSnapshot *)(puVar12 + 2);
                if ((cmStateSnapshot *)*puVar12 == pcVar19) {
                  local_350._16_8_ = pcVar19->State;
                  local_350._24_8_ = puVar12[3];
                }
                else {
                  local_350._16_8_ = pcVar19->State;
                  local_350._0_8_ = (cmStateSnapshot *)*puVar12;
                }
                local_350._8_8_ = puVar12[1];
                *puVar12 = pcVar19;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                puVar12 = (undefined8 *)std::__cxx11::string::append(local_350);
                pcVar19 = (cmStateSnapshot *)(puVar12 + 2);
                if ((cmStateSnapshot *)*puVar12 == pcVar19) {
                  local_198[0].State = pcVar19->State;
                  local_198[0].Position.Tree =
                       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)puVar12[3];
                  local_1a8._0_8_ = local_198;
                }
                else {
                  local_198[0].State = pcVar19->State;
                  local_1a8._0_8_ = (cmStateSnapshot *)*puVar12;
                }
                local_1a8._8_8_ = puVar12[1];
                *puVar12 = pcVar19;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_330,(string *)local_1a8);
                if ((cmStateSnapshot *)local_1a8._0_8_ != local_198) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198[0].State + 1));
                }
                if ((cmStateSnapshot *)local_350._0_8_ != (cmStateSnapshot *)(local_350 + 0x10)) {
                  operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
                }
                paVar15 = &local_320.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != paVar15) {
                  operator_delete(local_320._M_dataplus._M_p,
                                  CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                                           local_320.field_2._M_local_buf[0]) + 1);
                  paVar15 = extraout_RAX_02;
                }
                iVar11._M_current = (t_lookup *)CONCAT71((int7)((ulong)paVar15 >> 8),1);
                local_324 = FATAL_ERROR;
                local_2f0 = (cmStateSnapshot *)iVar11._M_current;
              }
              goto LAB_003d60bf;
            }
            pcVar22 = (cmStateSnapshot *)((long)&pcVar21->State + 7);
            local_280._M_dataplus._M_p._0_4_ = 2;
            pcVar19 = pcVar18;
          }
        }
        if (pcVar22 != (cmStateSnapshot *)0x0) {
          std::__cxx11::string::append((char *)&local_2e8,(ulong)pcVar19);
          pcVar21 = (cmStateSnapshot *)((long)&pcVar22[-1].Position.Position + 7);
          local_280._M_string_length = (size_type)local_2e0;
          pcVar19 = pcVar22;
          if (iStack_2c0._M_current == local_2b8) {
            std::vector<t_lookup,std::allocator<t_lookup>>::_M_realloc_insert<t_lookup_const&>
                      ((vector<t_lookup,std::allocator<t_lookup>> *)&local_2c8,iStack_2c0,
                       (t_lookup *)&local_280);
            iVar11._M_current = (t_lookup *)extraout_RAX_03;
          }
          else {
            *(pointer *)iStack_2c0._M_current = local_280._M_dataplus._M_p;
            (iStack_2c0._M_current)->loc = (size_t)local_2e0;
            iStack_2c0._M_current = iStack_2c0._M_current + 1;
            iVar11._M_current = (t_lookup *)local_2e0;
          }
        }
      }
    }
    else if (bVar1 == 0x40) {
      if (replaceAt) {
        pcVar19 = (cmStateSnapshot *)((long)&pcVar21->State + 1);
        pcVar22 = (cmStateSnapshot *)strchr((char *)pcVar19,0x40);
        iVar11._M_current =
             (t_lookup *)CONCAT71((int7)((ulong)pcVar22 >> 8),pcVar22 == (cmStateSnapshot *)0x0);
        bVar6 = true;
        if (pcVar22 != pcVar19 && pcVar22 != (cmStateSnapshot *)0x0) {
          sVar16 = strspn((char *)pcVar19,
                          "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-");
          iVar11._M_current = (t_lookup *)((long)&pcVar19->State + sVar16);
          if (pcVar22 == (cmStateSnapshot *)iVar11._M_current) {
            local_1a8._0_8_ = local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,pcVar19,
                       (char *)((long)&pcVar19->State + ~(ulong)pcVar21) + (long)pcVar22);
            pcVar14 = GetDefinition(local_300,(string *)local_1a8);
            if (pcVar14 == (char *)0x0) {
              pcVar14 = "";
            }
            std::__cxx11::string::string((string *)local_350,pcVar14,(allocator *)&local_320);
            if ((char)local_2a4 != '\0') {
              cmSystemTools::EscapeQuotes(&local_320,(string *)local_350);
              std::__cxx11::string::operator=((string *)local_350,(string *)&local_320);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p,
                                CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                                         local_320.field_2._M_local_buf[0]) + 1);
              }
            }
            std::__cxx11::string::append((char *)&local_2e8,(ulong)pcVar18);
            std::__cxx11::string::_M_append((char *)&local_2e8,local_350._0_8_);
            if ((cmStateSnapshot *)local_350._0_8_ != (cmStateSnapshot *)(local_350 + 0x10)) {
              operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
            }
            iVar11._M_current = (t_lookup *)local_198;
            if ((t_lookup *)local_1a8._0_8_ != iVar11._M_current) {
              operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198[0].State + 1));
              iVar11._M_current = (t_lookup *)extraout_RAX;
            }
            pcVar18 = (cmStateSnapshot *)((long)&pcVar22->State + 1);
            bVar6 = false;
            pcVar21 = pcVar22;
          }
        }
        pcVar19 = pcVar18;
        if (!bVar6) goto LAB_003d6130;
      }
LAB_003d5890:
      iVar11._M_current = (t_lookup *)local_2c8;
      pcVar19 = pcVar18;
      if (local_2c8 != (cmStateSnapshot *)iStack_2c0._M_current) {
        iVar9 = isalnum((int)(char)bVar1);
        iVar11._M_current = (t_lookup *)CONCAT44(extraout_var_00,iVar9);
        if ((iVar9 == 0) &&
           ((iVar11._M_current = (t_lookup *)(ulong)(bVar1 - 0x2b), 0x34 < bVar1 - 0x2b ||
            ((0x1000000000001dU >> ((ulong)iVar11._M_current & 0x3f) & 1) == 0)))) {
          std::__cxx11::string::append((char *)local_330);
          std::__cxx11::string::push_back((char)local_330);
          std::__cxx11::string::append((char *)&local_2e8,(ulong)pcVar18);
          std::__cxx11::string::substr((ulong)&local_320,(ulong)&local_2e8);
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,0x576f06);
          local_350._0_8_ = local_350 + 0x10;
          pcVar18 = (cmStateSnapshot *)(puVar12 + 2);
          if ((cmStateSnapshot *)*puVar12 == pcVar18) {
            local_350._16_8_ = pcVar18->State;
            local_350._24_8_ = puVar12[3];
          }
          else {
            local_350._16_8_ = pcVar18->State;
            local_350._0_8_ = (cmStateSnapshot *)*puVar12;
          }
          local_350._8_8_ = puVar12[1];
          *puVar12 = pcVar18;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append(local_350);
          local_1a8._0_8_ = local_198;
          pcVar18 = (cmStateSnapshot *)(puVar12 + 2);
          if ((cmStateSnapshot *)*puVar12 == pcVar18) {
            local_198[0].State = pcVar18->State;
            local_198[0].Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)puVar12[3]
            ;
          }
          else {
            local_198[0].State = pcVar18->State;
            local_1a8._0_8_ = (cmStateSnapshot *)*puVar12;
          }
          local_1a8._8_8_ = puVar12[1];
          *puVar12 = pcVar18;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_330,local_1a8._0_8_);
          if ((cmStateSnapshot *)local_1a8._0_8_ != local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198[0].State + 1));
          }
          if ((cmStateSnapshot *)local_350._0_8_ != (cmStateSnapshot *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
          }
          paVar15 = &local_320.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != paVar15) {
            operator_delete(local_320._M_dataplus._M_p,
                            CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                                     local_320.field_2._M_local_buf[0]) + 1);
            paVar15 = extraout_RAX_01;
          }
          iVar11._M_current = (t_lookup *)CONCAT71((int7)((ulong)paVar15 >> 8),1);
          local_324 = FATAL_ERROR;
          local_2f0 = (cmStateSnapshot *)iVar11._M_current;
        }
      }
    }
    else if (bVar1 == 0x5c) {
LAB_003d56a7:
      if ((char)local_254 != '\0') goto LAB_003d6130;
      pcVar22 = (cmStateSnapshot *)((long)&pcVar21->State + 1);
      bVar1 = *(byte *)((long)&pcVar21->State + 1);
      if (bVar1 < 0x72) {
        if (bVar1 == 0x3b) {
          iVar11._M_current = (t_lookup *)local_2c8;
          if (local_2c8 == (cmStateSnapshot *)iStack_2c0._M_current) goto LAB_003d5bd6;
        }
        else if (bVar1 == 0x6e) {
          std::__cxx11::string::append((char *)&local_2e8,(ulong)pcVar18);
          iVar11._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_2e8);
          goto LAB_003d5aa6;
        }
LAB_003d5a4b:
        iVar9 = isalnum((int)(char)bVar1);
        if ((bVar1 == 0) || (iVar9 != 0)) {
          uVar13 = std::__cxx11::string::append((char *)local_330);
          if (bVar1 != 0) {
            uVar13 = std::__cxx11::string::push_back((char)local_330);
          }
          local_2f0 = (cmStateSnapshot *)CONCAT71((int7)((ulong)uVar13 >> 8),1);
          iVar11._M_current = (t_lookup *)std::__cxx11::string::append((char *)local_330);
        }
        else {
          iVar11._M_current =
               (t_lookup *)std::__cxx11::string::append((char *)&local_2e8,(ulong)pcVar18);
          pcVar18 = pcVar22;
        }
      }
      else {
        if (bVar1 == 0x72) {
          std::__cxx11::string::append((char *)&local_2e8,(ulong)pcVar18);
          iVar11._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_2e8);
        }
        else {
          if (bVar1 != 0x74) goto LAB_003d5a4b;
          std::__cxx11::string::append((char *)&local_2e8,(ulong)pcVar18);
          iVar11._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_2e8);
        }
LAB_003d5aa6:
        pcVar18 = (cmStateSnapshot *)((long)&pcVar21->State + 2);
      }
LAB_003d5bd6:
      pcVar19 = pcVar18;
      if (*(char *)&pcVar18->State != '\0') {
        pcVar21 = pcVar22;
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_003d5890;
      iVar11._M_current = iStack_2c0._M_current;
      if (local_2c8 == (cmStateSnapshot *)iStack_2c0._M_current) goto LAB_003d6130;
      iVar9 = *(int *)&(((cmStateSnapshot *)((long)iStack_2c0._M_current + -0x18))->Position).Tree;
      uVar3 = (((cmStateSnapshot *)((long)iStack_2c0._M_current + -0x18))->Position).Position;
      iStack_2c0._M_current =
           (t_lookup *)&((cmStateSnapshot *)((long)iStack_2c0._M_current + -0x18))->Position;
      std::__cxx11::string::append((char *)&local_2e8,(ulong)pcVar18);
      std::__cxx11::string::substr((ulong)local_350,(ulong)&local_2e8);
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_320._M_string_length = 0;
      local_320.field_2._M_local_buf[0] = '\0';
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      local_280._M_string_length = 0;
      local_280.field_2._M_local_buf[0] = '\0';
      if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
           ::lineVar_abi_cxx11_ == '\0') &&
         (iVar10 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                        ::lineVar_abi_cxx11_), iVar10 != 0)) {
        ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
        ::lineVar_abi_cxx11_._M_dataplus._M_p =
             (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                       ::lineVar_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                    ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                             ::lineVar_abi_cxx11_);
      }
      if (iVar9 == 0) {
        if (((filename != (char *)0x0) &&
            (local_350._8_8_ ==
             ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
             ::lineVar_abi_cxx11_._M_string_length)) &&
           ((local_350._8_8_ == 0 ||
            (iVar9 = bcmp((void *)local_350._0_8_,
                          ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                          ::lineVar_abi_cxx11_._M_dataplus._M_p,local_350._8_8_), iVar9 == 0)))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::_M_insert<long>((long)local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&local_320,(string *)&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          goto LAB_003d5c81;
        }
        __s._M_p = GetDefinition(local_300,(string *)local_350);
      }
      else if (iVar9 == 1) {
        bVar6 = cmsys::SystemTools::GetEnv((string *)local_350,&local_280);
        __s._M_p = local_280._M_dataplus._M_p;
        if (!bVar6) goto LAB_003d5c81;
      }
      else if (iVar9 == 2) {
        __s._M_p = cmState::GetCacheEntryValue(local_230,(string *)local_350);
      }
      else {
LAB_003d5c81:
        __s._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
      }
      sVar5 = local_320._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__s._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if (((!removeEmpty) &&
            (local_300->GlobalGenerator->CMakeInstance->WarnUninitialized == true)) &&
           (bVar6 = cmStateSnapshot::IsInitialized(local_238,(string *)local_350), !bVar6)) {
          bVar6 = local_300->CheckSystemVars;
          bVar8 = true;
          if (bVar6 == false) {
            std::__cxx11::string::string((string *)&local_208,filename,&local_2f1);
            pcVar14 = cmake::GetHomeDirectory(local_300->GlobalGenerator->CMakeInstance);
            std::__cxx11::string::string((string *)&local_1c8,pcVar14,&local_2f2);
            bVar7 = cmsys::SystemTools::IsSubDirectory(&local_208,&local_1c8);
            if (bVar7) goto LAB_003d5df3;
            std::__cxx11::string::string((string *)&local_228,filename,&local_2f3);
            pcVar14 = cmake::GetHomeOutputDirectory(local_300->GlobalGenerator->CMakeInstance);
            std::__cxx11::string::string((string *)&local_1e8,pcVar14,&local_2f4);
            bVar8 = cmsys::SystemTools::IsSubDirectory(&local_228,&local_1e8);
            bVar7 = true;
          }
          else {
LAB_003d5df3:
            bVar7 = false;
          }
          if (bVar7) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (bVar6 == false) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (bVar8 != false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"uninitialized variable \'",0x18);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_350._0_8_,local_350._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\'",1);
            std::__cxx11::stringbuf::str();
            IssueMessage(local_300,AUTHOR_WARNING,&local_2a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
        }
      }
      else if ((char)local_2a4 == '\0') {
        strlen(__s._M_p);
        std::__cxx11::string::_M_replace((ulong)&local_320,0,(char *)sVar5,(ulong)__s._M_p);
      }
      else {
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        sVar16 = strlen(__s._M_p);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a0,__s._M_p,__s._M_p + sVar16);
        cmSystemTools::EscapeQuotes((string *)local_1a8,&local_2a0);
        std::__cxx11::string::operator=((string *)&local_320,(string *)local_1a8);
        if ((cmStateSnapshot *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198[0].State + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::replace
                ((ulong)&local_2e8,uVar3,(char *)((long)local_2e0 - uVar3),
                 (ulong)local_320._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,
                        CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                 local_280.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                                 local_320.field_2._M_local_buf[0]) + 1);
      }
      iVar11._M_current = (t_lookup *)(local_350 + 0x10);
      if ((t_lookup *)local_350._0_8_ != iVar11._M_current) {
        operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
        iVar11._M_current = (t_lookup *)extraout_RAX_00;
      }
      pcVar19 = (cmStateSnapshot *)((long)&pcVar21->State + 1);
    }
LAB_003d6130:
    MVar20 = local_324;
    if (((ulong)local_2f0 & 1) != 0) goto LAB_003d63c6;
  } while ((((ulong)local_248 & 1) == 0) &&
          (ppcVar4 = &pcVar21->State, pcVar21 = (cmStateSnapshot *)((long)&pcVar21->State + 1),
          pcVar18 = pcVar19, *(char *)((long)ppcVar4 + 1) != '\0'));
  if (local_2c8 != (cmStateSnapshot *)iStack_2c0._M_current) {
    local_2f0 = (cmStateSnapshot *)CONCAT71((int7)((ulong)local_2c8 >> 8),1);
    std::__cxx11::string::append((char *)local_330);
  }
LAB_003d63c6:
  if (((ulong)local_2f0 & 1) == 0) {
    std::__cxx11::string::append((char *)&local_2e8);
    std::__cxx11::string::_M_assign((string *)local_250);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      sVar16 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar17 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_250->_M_dataplus)._M_p,
                         local_250->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(local_330->_M_dataplus)._M_p,local_330->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_330,(string *)local_350);
    if ((cmStateSnapshot *)local_350._0_8_ != (cmStateSnapshot *)(local_350 + 0x10)) {
      operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    MVar20 = FATAL_ERROR;
  }
  if (local_2c8 != (cmStateSnapshot *)0x0) {
    operator_delete(local_2c8,(long)local_2b8 - (long)local_2c8);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
  }
  return MVar20;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool removeEmpty, bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do {
    char inc = *in;
    switch (inc) {
      case '}':
        if (!openstack.empty()) {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = CM_NULLPTR;
          std::string varresult;
          std::string svalue;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch (var.domain) {
            case NORMAL:
              if (filename && lookup == lineVar) {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
              } else {
                value = this->GetDefinition(lookup);
              }
              break;
            case ENVIRONMENT:
              if (cmSystemTools::GetEnv(lookup, svalue)) {
                value = svalue.c_str();
              }
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
          }
          // Get the string we're meant to append to.
          if (value) {
            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(value);
            } else {
              varresult = value;
            }
          } else if (!removeEmpty) {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if (this->GetCMakeInstance()->GetWarnUninitialized() &&
                !this->VariableInitialized(lookup)) {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(
                    filename, this->GetHomeOutputDirectory())) {
                std::ostringstream msg;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
              }
            }
          }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
        }
        break;
      case '$':
        if (!atOnly) {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = CM_NULLPTR;
          char nextc = *next;
          if (nextc == '{') {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
          } else if (nextc == '<') {
          } else if (!nextc) {
            result.append(last, next - last);
            last = next;
          } else if (cmHasLiteralPrefix(next, "ENV{")) {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
          } else if (cmHasLiteralPrefix(next, "CACHE{")) {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
          } else {
            if (this->cmNamedCurly.find(next)) {
              errorstr = "Syntax $" +
                std::string(next, this->cmNamedCurly.end()) +
                "{} is not supported.  Only ${}, $ENV{}, "
                "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
            }
          }
          if (start) {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
          }
          break;
        }
        CM_FALLTHROUGH;
      case '\\':
        if (!noEscapes) {
          const char* next = in + 1;
          char nextc = *next;
          if (nextc == 't') {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
          } else if (nextc == 'n') {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
          } else if (nextc == 'r') {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
          } else if (nextc == ';' && openstack.empty()) {
            // Handled in ExpandListArgument; pass the backslash literally.
          } else if (isalnum(nextc) || nextc == '\0') {
            errorstr += "Invalid character escape '\\";
            if (nextc) {
              errorstr += nextc;
              errorstr += "'.";
            } else {
              errorstr += "' (at end of input).";
            }
            error = true;
          } else {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
          }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if (*last) {
            ++in;
          }
        }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if (replaceAt) {
          const char* nextAt = strchr(in + 1, '@');
          if (nextAt && nextAt != in + 1 &&
              nextAt ==
                in + 1 + strspn(in + 1, "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                                        "abcdefghijklmnopqrstuvwxyz"
                                        "0123456789/_.+-")) {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(varresult);
            }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
          }
        }
      // Failed to find a valid @ expansion; treat it as literal.
      /* FALLTHROUGH */
      default: {
        if (!openstack.empty() &&
            !(isalnum(inc) || inc == '_' || inc == '/' || inc == '.' ||
              inc == '+' || inc == '-')) {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" +
            result.substr(openstack.back().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
        }
        break;
      }
    }
    // Look at the next character.
  } while (!error && !done && *++in);

  // Check for open variable references yet.
  if (!error && !openstack.empty()) {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
  }

  if (error) {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if (filename) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
           << "  " << filename << ":" << line << "\n";
    }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
  } else {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
  }

  return mtype;
}